

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_UnknownSize2_Test::TestBody(RangeMapTest_UnknownSize2_Test *this)

{
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  long in_RDI;
  string *in_stack_fffffffffffffe58;
  RangeMapTest *in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe68;
  RangeMap *in_stack_fffffffffffffe70;
  allocator_type *in_stack_fffffffffffffe88;
  undefined8 ***pppuVar1;
  allocator<char> *in_stack_fffffffffffffe90;
  undefined8 ***pppuVar2;
  char *in_stack_fffffffffffffe98;
  iterator pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_10c [3];
  allocator<char> local_109;
  undefined8 **local_108;
  undefined8 **local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined8 **local_90;
  undefined8 local_88;
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  RangeMap::AddRange(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     (uint64_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  RangeMap::AddRange(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     (uint64_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  local_10c[1] = 1;
  local_108 = &local_100;
  local_100 = (undefined8 **)0x5f;
  local_f8 = 100;
  local_f0 = *(undefined8 *)(in_RDI + 0xa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  local_108 = (undefined8 **)&local_c8;
  local_c8 = 100;
  local_c0 = 0x69;
  local_b8 = *(undefined8 *)(in_RDI + 0xa0);
  this_00 = &local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  local_10c[1] = 0;
  local_90 = &local_100;
  local_88 = 2;
  pEVar3 = (iterator)local_10c;
  std::allocator<bloaty::RangeMapTest::Entry>::allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x179402);
  __l._M_len = (size_type)this_00;
  __l._M_array = pEVar3;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe90,__l,in_stack_fffffffffffffe88);
  RangeMapTest::AssertMainMapEquals
            (in_stack_fffffffffffffe60,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe58);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             in_stack_fffffffffffffe70);
  std::allocator<bloaty::RangeMapTest::Entry>::~allocator
            ((allocator<bloaty::RangeMapTest::Entry> *)0x179454);
  pppuVar1 = &local_100;
  pppuVar2 = &local_90;
  do {
    pppuVar2 = pppuVar2 + -7;
    RangeMapTest::Entry::~Entry((Entry *)0x17947d);
  } while (pppuVar2 != pppuVar1);
  std::allocator<char>::~allocator((allocator<char> *)(local_10c + 2));
  std::allocator<char>::~allocator(&local_109);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize2) {
  // This case is slightly weird, but we do consider the "100" below to be a
  // hard fact even if the size is unknown, so the "[95, 105]: bar" range
  // doesn't override it.
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(95, 10, "bar");
  AssertMainMapEquals({
    {95, 100, kNoTranslation, "bar"},
    {100, 105, kNoTranslation, "foo"},
  });
}